

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

AssertionResult * __thiscall
Catch::ExpressionResultBuilder::buildResult
          (AssertionResult *__return_storage_ptr__,ExpressionResultBuilder *this,AssertionInfo *info
          )

{
  bool bVar1;
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  string local_d8 [32];
  undefined1 local_b8 [80];
  undefined1 local_68 [8];
  AssertionResultData data;
  AssertionInfo *info_local;
  ExpressionResultBuilder *this_local;
  
  data._64_8_ = info;
  if ((this->m_data).resultType == Unknown) {
    __assert_fail("m_data.resultType != ResultWas::Unknown",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jjh13[P]sisl/test/../include/catch/catch.hpp"
                  ,0x1844,
                  "AssertionResult Catch::ExpressionResultBuilder::buildResult(const AssertionInfo &) const"
                 );
  }
  AssertionResultData::AssertionResultData((AssertionResultData *)local_68,&this->m_data);
  if ((((this->m_exprComponents).shouldNegate & 1U) == 0) || (data._56_4_ != 0)) {
    if ((((this->m_exprComponents).shouldNegate & 1U) != 0) && (data._56_4_ == 0x11)) {
      data._56_4_ = 0;
    }
  }
  else {
    data._56_4_ = 0x11;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&data.field_0x18,(string *)(local_b8 + 0x30));
  std::__cxx11::string::~string((string *)(local_b8 + 0x30));
  reconstructExpression_abi_cxx11_((ExpressionResultBuilder *)local_b8,(AssertionInfo *)this);
  std::__cxx11::string::operator=((string *)local_68,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  if (((this->m_exprComponents).shouldNegate & 1U) != 0) {
    bVar1 = std::operator==(&(this->m_exprComponents).op,"");
    if (bVar1) {
      std::operator+((char *)local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b37f4);
      std::__cxx11::string::operator=((string *)local_68,local_d8);
      std::__cxx11::string::~string(local_d8);
    }
    else {
      std::operator+((char *)local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"!(");
      std::operator+(local_f8,(char *)local_118);
      std::__cxx11::string::operator=((string *)local_68,(string *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string(local_118);
    }
  }
  AssertionResult::AssertionResult
            (__return_storage_ptr__,(AssertionInfo *)data._64_8_,(AssertionResultData *)local_68);
  AssertionResultData::~AssertionResultData((AssertionResultData *)local_68);
  return __return_storage_ptr__;
}

Assistant:

AssertionResult ExpressionResultBuilder::buildResult( AssertionInfo const& info ) const
    {
        assert( m_data.resultType != ResultWas::Unknown );

        AssertionResultData data = m_data;

        // Flip bool results if shouldNegate is set
        if( m_exprComponents.shouldNegate && data.resultType == ResultWas::Ok )
            data.resultType = ResultWas::ExpressionFailed;
        else if( m_exprComponents.shouldNegate && data.resultType == ResultWas::ExpressionFailed )
            data.resultType = ResultWas::Ok;

        data.message = m_stream.str();
        data.reconstructedExpression = reconstructExpression( info );
        if( m_exprComponents.shouldNegate ) {
            if( m_exprComponents.op == "" )
                data.reconstructedExpression = "!" + data.reconstructedExpression;
            else
                data.reconstructedExpression = "!(" + data.reconstructedExpression + ")";
        }
        return AssertionResult( info, data );
    }